

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O2

charcount_t __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::LineLength
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,EncodedCharPtr first,EncodedCharPtr last,
          size_t *cb)

{
  code *pcVar1;
  EncodedCharPtr puVar2;
  bool bVar3;
  OLECHAR OVar4;
  undefined4 *puVar5;
  charcount_t cVar6;
  size_t sVar7;
  EncodedCharPtr local_48;
  EncodedCharPtr p;
  size_t *local_38;
  
  if (cb == (size_t *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,199,"(cb != nullptr)","cb != nullptr");
    if (!bVar3) goto LAB_00d553a7;
    *puVar5 = 0;
  }
  cVar6 = 0;
  local_48 = first;
  p = first;
  local_38 = cb;
  while( true ) {
    puVar2 = local_48;
    OVar4 = UTF8EncodingPolicyBase<false>::ReadFull<false>
                      (&this->super_UTF8EncodingPolicyBase<false>,&local_48,last);
    if ((((ushort)OVar4 < 0xe) && ((0x2401U >> ((ushort)OVar4 & 0x1f) & 1) != 0)) ||
       ((ushort)OVar4 - 0x2028 < 2)) break;
    cVar6 = cVar6 + 1;
  }
  sVar7 = (long)puVar2 - (long)p;
  if (puVar2 < p) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0xdb,"(prev >= first)","prev >= first");
    if (!bVar3) {
LAB_00d553a7:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  *local_38 = sVar7;
  return cVar6;
}

Assistant:

charcount_t Scanner<EncodingPolicy>::LineLength(EncodedCharPtr first, EncodedCharPtr last, size_t* cb)
{
    Assert(cb != nullptr);

    charcount_t result = 0;
    EncodedCharPtr p = first;

    for (;;)
    {
        EncodedCharPtr prev = p;
        switch( this->template ReadFull<false>(p, last) )
        {
            case kchNWL: // _C_NWL
            case kchRET:
            case kchLS:
            case kchPS:
            case kchNUL: // _C_NUL
                // p is now advanced past the line terminator character.
                // We need to know the number of bytes making up the line, not including the line terminator character.
                // To avoid subtracting a variable number of bytes because the line terminator characters are different
                // number of bytes long (plus there may be multiple valid encodings for these characters) just keep
                // track of the first byte of the line terminator character in prev.
                Assert(prev >= first);
                *cb = prev - first;
                return result;
        }
        result++;
    }
}